

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

void __thiscall rsg::AssignOp::~AssignOp(AssignOp *this)

{
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__AssignOp_01e7a840;
  if (this->m_lvalueExpr != (Expression *)0x0) {
    (*this->m_lvalueExpr->_vptr_Expression[1])();
  }
  if (this->m_rvalueExpr != (Expression *)0x0) {
    (*this->m_rvalueExpr->_vptr_Expression[1])();
  }
  std::_Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>::~_Vector_base
            ((_Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_> *)&this->m_value);
  ValueRange::~ValueRange(&this->m_valueRange);
  return;
}

Assistant:

AssignOp::~AssignOp (void)
{
	delete m_lvalueExpr;
	delete m_rvalueExpr;
}